

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  long lVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  UnitTestImpl *pUVar7;
  long lVar8;
  long lVar9;
  TestCase *this;
  long lVar10;
  TestInfo *pTVar11;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = UnitTestImpl::failed_test_count(unit_test->impl_);
  if (iVar4 != 0) {
    pUVar7 = unit_test->impl_;
    ppTVar5 = (pUVar7->test_cases_).
              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pUVar7->test_cases_).
                                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
      lVar10 = 0;
      do {
        piVar2 = (pUVar7->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((lVar10 < (int)((ulong)((long)(pUVar7->test_case_indices_).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar2) >> 2))
           && (-1 < piVar2[lVar10])) {
          this = ppTVar5[lVar10];
        }
        else {
          this = (TestCase *)0x0;
        }
        if (this->should_run_ == true) {
          iVar4 = TestCase::failed_test_count(this);
          if ((iVar4 != 0) &&
             (ppTVar6 = (this->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(this->test_info_list_).
                                     super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6) >>
                      3))) {
            lVar9 = 0;
            do {
              piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((lVar9 < (int)((ulong)((long)(this->test_indices_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish - (long)piVar2) >>
                                2)) && (lVar8 = (long)piVar2[lVar9], -1 < lVar8)) {
                pTVar11 = ppTVar6[lVar8];
              }
              else {
                pTVar11 = (TestInfo *)0x0;
              }
              if (pTVar11->should_run_ == true) {
                bVar3 = TestResult::Failed(&pTVar11->result_);
                if (bVar3) {
                  ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
                  printf("%s.%s",(this->name_)._M_dataplus._M_p,(pTVar11->name_)._M_dataplus._M_p);
                  PrintFullTestCommentIfPresent
                            ((internal *)(pTVar11->type_param_).ptr_,
                             (TestInfo *)(pTVar11->value_param_).ptr_);
                  putchar(10);
                }
              }
              lVar9 = lVar9 + 1;
              ppTVar6 = (this->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar9 < (int)((ulong)((long)(this->test_info_list_).
                                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar6) >> 3));
          }
        }
        lVar10 = lVar10 + 1;
        pUVar7 = unit_test->impl_;
        ppTVar5 = (pUVar7->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar10 < (int)((ulong)((long)(pUVar7->test_cases_).
                                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppTVar5) >> 3));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || test_info.result()->Passed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}